

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
TextReaderTest_ReadTillEndOfLine_Test::TestBody(TextReaderTest_ReadTillEndOfLine_Test *this)

{
  CStringRef name;
  NLStringRef data;
  undefined1 uVar1;
  TextReader<fmt::Locale> *this_00;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  TextReader reader;
  char *in_stack_fffffffffffffec8;
  NLStringRef *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  TextReader<fmt::Locale> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  Type in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  allocator<char> *__s;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  allocator<char> local_b9;
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_98 [2];
  BasicCStringRef<char> local_78 [15];
  
  mp::NLStringRef::NLStringRef(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_78,"test");
  data.size_._0_7_ = in_stack_ffffffffffffff10;
  data.data_ = (char *)in_stack_ffffffffffffff08;
  data.size_._7_1_ = in_stack_ffffffffffffff17;
  name.data_._7_1_ = in_stack_ffffffffffffff07;
  name.data_._0_7_ = in_stack_ffffffffffffff00;
  mp::internal::TextReader<fmt::Locale>::TextReader
            ((TextReader<fmt::Locale> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),data,name);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_fffffffffffffef0);
  testing::AssertionSuccess();
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if ((bool)uVar1) {
    __s = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff10),(char *)__s,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    std::allocator<char>::~allocator(&local_b9);
    in_stack_ffffffffffffff07 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffff07) {
      mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_fffffffffffffef0);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (char (*) [109])CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  this_00 = (TextReader<fmt::Locale> *)
            testing::AssertionResult::failure_message((AssertionResult *)0x13c897);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc,(char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             in_stack_fffffffffffffee0);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  testing::Message::~Message((Message *)0x13c8e5);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c934);
  mp::internal::TextReader<fmt::Locale>::~TextReader(this_00);
  return;
}

Assistant:

TEST(TextReaderTest, ReadTillEndOfLine) {
  TextReader reader("ab cde\nfg h", "test");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadTillEndOfLine(), mp::ReadError,
                   "test:2:5: expected newline");
}